

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O2

void drawAntiRound2(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = x + width;
  dVar6 = height * 0.5;
  dVar3 = width * 0.5;
  std::operator<<(out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"");
  std::operator<<(out," M ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  dVar4 = dVar6 + y;
  std::ostream::_M_insert<double>(dVar4);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar4);
  std::operator<<(out," A ");
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar1," 0 0 1 ");
  poVar1 = std::ostream::_M_insert<double>(dVar3 + x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y + height);
  std::operator<<(out," L ");
  dVar5 = dVar2 - dVar3;
  poVar1 = std::ostream::_M_insert<double>(dVar5);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y + height);
  std::operator<<(out," A ");
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar1," 0 0 0 ");
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar4);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar4);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar4);
  std::operator<<(out," A ");
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar1," 0 0 1 ");
  poVar1 = std::ostream::_M_insert<double>(dVar5);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(dVar5);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(dVar3 + x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y);
  std::operator<<(out," A ");
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar1," 0 0 1 ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar4);
  std::operator<<(out," z\"");
  std::operator<<(out,"/>\n");
  return;
}

Assistant:

void drawAntiRound2(ostream& out, double x, double y, double width, double height) {
	double& h = height;
	double& w = width;
	double x2 = x+w;
	double y2 = y+h;
	double m  = h/2.0;
	double d  = w/2.0;
	double Rx  = d;
	double Ry  = h/2;

	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << " M " << x          << " " << y+m;
	out << " L " << x           << " " << y+m;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x+d << " " << y2;
	out << " L " << x2-d        << " " << y2;
	out << " A " << Rx << " " << Ry << " 0 0 0 " << x2 << " " << y+m;
	out << " L " << x2          << " " << y+m;
	out << " L " << x2          << " " << y+m;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x2-d << " " << y;
	out << " L " << x2-d        << " " << y;
	out << " L " << x+d         << " " << y;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x << " " << y+m;
	out << " z\"";
	out << "/>\n";
}